

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
DensityCalculator<double,_float>::initialize
          (DensityCalculator<double,_float> *this,size_t max_depth,int max_categ,bool reserve_counts
          ,ScoringMetric scoring_metric)

{
  pointer pdVar1;
  double local_28;
  
  std::vector<double,_std::allocator<double>_>::reserve(&this->multipliers,max_depth + 3);
  pdVar1 = (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  if (scoring_metric == AdjDensity) {
    local_28 = 1.0;
  }
  else {
    local_28 = 0.0;
  }
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->multipliers,&local_28);
  if (reserve_counts) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->counts,(long)max_categ);
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize(size_t max_depth, int max_categ, bool reserve_counts, ScoringMetric scoring_metric)
{
    this->multipliers.reserve(max_depth+3);
    this->multipliers.clear();
    if (scoring_metric != AdjDensity)
        this->multipliers.push_back(0);
    else
        this->multipliers.push_back(1);

    if (reserve_counts)
    {
        this->counts.resize(max_categ);
    }
}